

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O1

void __thiscall DHUDMessage::Serialize(DHUDMessage *this,FArchive *arc)

{
  undefined8 in_RAX;
  FArchive *pFVar1;
  BYTE val;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  DObject::Serialize(&this->super_DObject,arc);
  pFVar1 = FArchive::operator<<(arc,&this->Left);
  pFVar1 = FArchive::operator<<(pFVar1,&this->Top);
  pFVar1 = FArchive::operator<<(pFVar1,&this->CenterX);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->HoldTics);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->Tics);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->State);
  uStack_28._7_1_ = (char)this->TextColor;
  FArchive::operator<<(pFVar1,(BYTE *)((long)&uStack_28 + 7));
  this->TextColor = (uint)(byte)uStack_28._7_1_;
  pFVar1 = FArchive::operator<<(pFVar1,&this->SBarID);
  pFVar1 = FArchive::operator<<(pFVar1,&this->SourceText);
  pFVar1 = SerializeFFontPtr(pFVar1,&this->Font);
  pFVar1 = FArchive::SerializeObject(pFVar1,(DObject **)&this->Next,RegistrationInfo.MyClass);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->HUDWidth);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->HUDHeight);
  pFVar1 = FArchive::operator<<(pFVar1,&this->NoWrap);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->ClipX);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->ClipY);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->ClipWidth);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->ClipHeight);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->WrapWidth);
  pFVar1 = FArchive::operator<<(pFVar1,&this->HandleAspect);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->VisibilityFlags);
  pFVar1 = ::operator<<(pFVar1,&this->Style);
  FArchive::operator<<(pFVar1,&this->Alpha);
  if (arc->m_Loading == true) {
    this->Lines = (FBrokenLines *)0x0;
    (*(this->super_DObject)._vptr_DObject[7])(this,this->SourceText);
  }
  return;
}

Assistant:

void DHUDMessage::Serialize(FArchive &arc)
{
	Super::Serialize(arc);
	arc << Left << Top << CenterX << HoldTics
		<< Tics << State << TextColor
		<< SBarID << SourceText << Font << Next
		<< HUDWidth << HUDHeight
		<< NoWrap
		<< ClipX << ClipY << ClipWidth << ClipHeight
		<< WrapWidth
		<< HandleAspect
		<< VisibilityFlags
		<< Style << Alpha;
	if (arc.IsLoading())
	{
		Lines = NULL;
		ResetText(SourceText);
	}
}